

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_copy_submat(m2v *A,int A_row_offs,int A_col_offs,int n_row,int n_col,m2v *At,
                    int At_row_offs,int At_col_offs)

{
  int val;
  int iVar1;
  int iVar2;
  int c;
  int c_00;
  bool bVar3;
  
  iVar1 = 0;
  if (n_col < 1) {
    n_col = 0;
  }
  if (n_row < 1) {
    n_row = 0;
  }
  for (; iVar1 != n_row; iVar1 = iVar1 + 1) {
    c = A_col_offs;
    c_00 = At_col_offs;
    iVar2 = n_col;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      val = m2v_get_el(A,iVar1 + A_row_offs,c);
      m2v_set_el(At,iVar1 + At_row_offs,c_00,val);
      c_00 = c_00 + 1;
      c = c + 1;
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_copy_submat)(const MV_GEN_TYPE* A,
				int A_row_offs,
				int A_col_offs,
				int n_row,
				int n_col,
				MV_GEN_TYPE* At,
				int At_row_offs,
				int At_col_offs)
{
	assert(0 <= n_row);
	assert(0 <= n_col);

	assert(0 <= A_row_offs);
	assert(0 <= A_col_offs);
	assert(A_row_offs + n_row <= A->n_row);
	assert(A_col_offs + n_col <= A->n_col);

	assert(0 <= At_row_offs);
	assert(0 <= At_col_offs);
	assert(At_row_offs + n_row <= At->n_row);
	assert(At_col_offs + n_col <= At->n_col);

	for (int r = 0; r < n_row; ++r) {
		for (int c = 0; c < n_col; ++c) {
			MV_GEN_N(_set_el)(At,
			  r + At_row_offs,
			  c + At_col_offs,
			  MV_GEN_N(_get_el)(A, r + A_row_offs, c + A_col_offs));
		}
	}
}